

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall hwnet::util::TimerMgr::~TimerMgr(TimerMgr *this)

{
  Timer *pTVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ppTVar4;
  ulong uVar5;
  
  if (this->elements_size != 0) {
    uVar5 = 0;
    do {
      pTVar1 = (this->elements).
               super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      p_Var2 = (pTVar1->mCallback).super__Function_base._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)((_Any_data *)&pTVar1->mCallback,(_Any_data *)&pTVar1->mCallback,__destroy_functor)
        ;
        (pTVar1->mCallback).super__Function_base._M_manager = (_Manager_type)0x0;
        (pTVar1->mCallback)._M_invoker = (_Invoker_type)0x0;
      }
      pTVar1 = (this->elements).
               super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      (pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var3 = (pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->elements_size);
  }
  ppTVar4 = (this->elements).
            super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4,(long)(this->elements).
                                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar4
                   );
  }
  p_Var3 = (this->empty_element_ptr).
           super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

~TimerMgr(){
		for(size_t i = 0; i < this->elements_size;i++) {
			this->elements[i]->mCallback = nullptr;
			this->elements[i]->selfPtr = nullptr;
		}
	}